

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
* __thiscall
wasm::SubTypes::getMaxDepths
          (unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
           *__return_storage_ptr__,SubTypes *this)

{
  uint uVar1;
  mapped_type mVar2;
  bool bVar3;
  undefined4 uVar4;
  BasicHeapType BVar5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  reference pHVar6;
  reference pHVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  uint *puVar10;
  HeapType local_160;
  HeapType local_158;
  HeapType local_150;
  HeapType local_148;
  HeapType local_140;
  Shareability local_134;
  const_iterator pSStack_130;
  Shareability share_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  initializer_list<wasm::Shareability> local_118;
  initializer_list<wasm::Shareability> *local_108;
  initializer_list<wasm::Shareability> *__range2_2;
  mapped_type *local_f8;
  mapped_type *basicDepth;
  HeapType local_e8;
  HeapType local_e0;
  HeapType local_d8;
  Shareability local_cc;
  HeapType HStack_c8;
  Shareability share;
  HeapType basic;
  HeapType type_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  key_type local_98;
  HeapType subType;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  HeapType HStack_68;
  Index depth;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_28;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  SubTypes *local_18;
  SubTypes *this_local;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *depths;
  
  __range2._7_1_ = 0;
  local_18 = this;
  this_local = (SubTypes *)__return_storage_ptr__;
  std::
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  ::unordered_map(__return_storage_ptr__);
  getSubTypesFirstSort(&local_40,this);
  local_28 = &local_40;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_28);
  type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_28);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar3) {
    pHVar7 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    HStack_68.id = pHVar7->id;
    __range3._4_4_ = 0;
    this_00 = getImmediateSubTypes(this,HStack_68);
    __end3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
    subType.id = (uintptr_t)
                 std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&subType), uVar1 = __range3._4_4_, bVar3) {
      pHVar6 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end3);
      local_98.id = pHVar6->id;
      pmVar8 = std::
               unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
               ::operator[](__return_storage_ptr__,&local_98);
      __range2_1._4_4_ = *pmVar8 + 1;
      puVar10 = std::max<unsigned_int>
                          ((uint *)((long)&__range3 + 4),(uint *)((long)&__range2_1 + 4));
      __range3._4_4_ = *puVar10;
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end3);
    }
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&stack0xffffffffffffff98);
    *pmVar8 = uVar1;
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_40);
  __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(&this->types);
  type_1.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(&this->types);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                             *)&type_1), bVar3) {
    pHVar7 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2_1);
    basic.id = pHVar7->id;
    HeapType::HeapType(&stack0xffffffffffffff38);
    local_cc = ::wasm::HeapType::getShared();
    uVar4 = ::wasm::HeapType::getKind();
    switch(uVar4) {
    case 0:
      ::wasm::handle_unreachable
                ("unexpected kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtypes.h"
                 ,0x84);
    case 1:
      BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::func,local_cc);
      HeapType::HeapType(&local_d8,BVar5);
      HStack_c8.id = local_d8.id;
      break;
    case 2:
      BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,local_cc);
      HeapType::HeapType(&local_e0,BVar5);
      HStack_c8.id = local_e0.id;
      break;
    case 3:
      BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::array,local_cc);
      HeapType::HeapType(&local_e8,BVar5);
      HStack_c8.id = local_e8.id;
      break;
    case 4:
      BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::cont,local_cc);
      HeapType::HeapType((HeapType *)&basicDepth,BVar5);
      HStack_c8.id = (uintptr_t)basicDepth;
    }
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&stack0xffffffffffffff38);
    local_f8 = pmVar8;
    pmVar9 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&basic);
    __range2_2._4_4_ = *pmVar9 + 1;
    puVar10 = std::max<unsigned_int>(pmVar8,(uint *)((long)&__range2_2 + 4));
    *local_f8 = *puVar10;
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2_1);
  }
  __begin2_2._0_4_ = 1;
  __begin2_2._4_4_ = 0;
  local_118._M_array = (iterator)&__begin2_2;
  local_118._M_len = 2;
  local_108 = &local_118;
  __end2_2 = std::initializer_list<wasm::Shareability>::begin(local_108);
  pSStack_130 = std::initializer_list<wasm::Shareability>::end(local_108);
  for (; __end2_2 != pSStack_130; __end2_2 = __end2_2 + 1) {
    local_134 = *__end2_2;
    BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,local_134);
    HeapType::HeapType(&local_140,BVar5);
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_140);
    BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::array,local_134);
    HeapType::HeapType(&local_148,BVar5);
    pmVar9 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_148);
    puVar10 = std::max<unsigned_int>(pmVar8,pmVar9);
    uVar1 = *puVar10;
    BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::eq,local_134);
    HeapType::HeapType(&local_150,BVar5);
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_150);
    *pmVar8 = uVar1 + 1;
    BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::eq,local_134);
    HeapType::HeapType(&local_158,BVar5);
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_158);
    mVar2 = *pmVar8;
    BVar5 = HeapType::getBasic((HeapType *)&HeapTypes::any,local_134);
    HeapType::HeapType(&local_160,BVar5);
    pmVar8 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,&local_160);
    *pmVar8 = mVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<HeapType, Index> getMaxDepths() {
    std::unordered_map<HeapType, Index> depths;

    for (auto type : getSubTypesFirstSort()) {
      // Begin with depth 0, then take into account the subtype depths.
      Index depth = 0;
      for (auto subType : getImmediateSubTypes(type)) {
        depth = std::max(depth, depths[subType] + 1);
      }
      depths[type] = depth;
    }

    // Add the max depths of basic types.
    for (auto type : types) {
      HeapType basic;
      auto share = type.getShared();
      switch (type.getKind()) {
        case HeapTypeKind::Func:
          basic = HeapTypes::func.getBasic(share);
          break;
        case HeapTypeKind::Struct:
          basic = HeapTypes::struct_.getBasic(share);
          break;
        case HeapTypeKind::Array:
          basic = HeapTypes::array.getBasic(share);
          break;
        case HeapTypeKind::Cont:
          basic = HeapTypes::cont.getBasic(share);
          break;
        case HeapTypeKind::Basic:
          WASM_UNREACHABLE("unexpected kind");
      }
      auto& basicDepth = depths[basic];
      basicDepth = std::max(basicDepth, depths[type] + 1);
    }

    for (auto share : {Unshared, Shared}) {
      depths[HeapTypes::eq.getBasic(share)] =
        std::max(depths[HeapTypes::struct_.getBasic(share)],
                 depths[HeapTypes::array.getBasic(share)]) +
        1;
      depths[HeapTypes::any.getBasic(share)] =
        depths[HeapTypes::eq.getBasic(share)] + 1;
    }

    return depths;
  }